

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lundump.c
# Opt level: O0

TString * LoadString(LoadState *S)

{
  byte bVar1;
  TString *ts;
  char buff [40];
  size_t size;
  LoadState *S_local;
  
  bVar1 = LoadByte(S);
  buff._32_8_ = ZEXT18(bVar1);
  if (buff._32_8_ == 0xff) {
    LoadBlock(S,buff + 0x20,8);
  }
  if (buff._32_8_ == 0) {
    S_local = (LoadState *)0x0;
  }
  else {
    buff._32_8_ = buff._32_8_ - 1;
    if ((ulong)buff._32_8_ < 0x29) {
      LoadBlock(S,&ts,buff._32_8_);
      S_local = (LoadState *)luaS_newlstr(S->L,(char *)&ts,buff._32_8_);
    }
    else {
      S_local = (LoadState *)luaS_createlngstrobj(S->L,buff._32_8_);
      LoadBlock(S,&S_local->version,buff._32_8_);
    }
  }
  return (TString *)S_local;
}

Assistant:

static TString *LoadString (LoadState *S) {
  size_t size = LoadByte(S);
  if (size == 0xFF)
    LoadVar(S, size);
  if (size == 0)
    return NULL;
  else if (--size <= LUAI_MAXSHORTLEN) {  /* short string? */
    char buff[LUAI_MAXSHORTLEN];
    LoadVector(S, buff, size);
    return luaS_newlstr(S->L, buff, size);
  }
  else {  /* long string */
    TString *ts = luaS_createlngstrobj(S->L, size);
    LoadVector(S, getstr(ts), size);  /* load directly in final place */
    return ts;
  }
}